

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.h
# Opt level: O1

Rnm_Obj_t * Rnm_ManObj(Rnm_Man_t *p,Gia_Obj_t *pObj,int f)

{
  if (((~*(ulong *)pObj & 0x1fffffff1fffffff) != 0) && (pObj->Value == 0)) {
    __assert_fail("Gia_ObjIsConst0(pObj) || pObj->Value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                  ,0x5f,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
  }
  if (p->nObjsFrame <= (int)pObj->Value) {
    __assert_fail("(int)pObj->Value < p->nObjsFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                  ,0x60,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
  }
  if ((-1 < f) && (f <= p->pCex->iFrame)) {
    return p->pObjs + (long)(p->nObjsFrame * f) + (ulong)pObj->Value;
  }
  __assert_fail("f >= 0 && f <= p->pCex->iFrame",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                ,0x61,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
}

Assistant:

static inline Rnm_Obj_t * Rnm_ManObj( Rnm_Man_t * p, Gia_Obj_t * pObj, int f )  
{ 
    assert( Gia_ObjIsConst0(pObj) || pObj->Value );
    assert( (int)pObj->Value < p->nObjsFrame );
    assert( f >= 0 && f <= p->pCex->iFrame ); 
    return p->pObjs + f * p->nObjsFrame + pObj->Value;  
}